

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeShaderBuiltinVarTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::compute::anon_unknown_0::ComputeBuiltinVarInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeBuiltinVarInstance *this)

{
  pointer a;
  pointer pSVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  ProgramCollection<vk::ProgramBinary> *this_00;
  void *pvVar4;
  TestContext *pTVar5;
  bool bVar6;
  int ndx;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ostream *this_01;
  Allocator *pAVar11;
  DescriptorSetLayoutBuilder *pDVar12;
  ProgramBinary *binary;
  DescriptorPoolBuilder *pDVar13;
  DescriptorSetUpdateBuilder *pDVar14;
  ulong uVar15;
  uint uVar16;
  UVec3 *b;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  int local_5b0;
  UVec3 refLocalID;
  UVec3 resValue;
  LogComps local_558;
  RefBase<vk::VkCommandBuffer_s_*> local_548;
  UVec3 refValue;
  UVec3 refGlobalID;
  UVec3 refGroupID;
  LogComps local_4f8;
  UVec3 globalSize;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_4d8;
  VkBufferMemoryBarrier bufferBarrier;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_478;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_458;
  VkDescriptorBufferInfo uniformDescriptorInfo;
  VkDescriptorBufferInfo resultDescriptorInfo;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_408;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_3e8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_3c8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_3a8;
  Buffer resultBuffer;
  undefined1 local_358 [8];
  pointer pWStack_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348 [23];
  Buffer uniformBuffer;
  ostringstream program_name;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program_name);
  this_01 = std::operator<<((ostream *)&program_name,
                            (string *)compute::(anonymous_namespace)::s_prefixProgramName_abi_cxx11_
                           );
  std::ostream::operator<<(this_01,this->m_subCaseNdx);
  pSVar1 = (this->m_subCases).
           super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  a = pSVar1 + this->m_subCaseNdx;
  b = &pSVar1[this->m_subCaseNdx].m_numWorkGroups;
  tcu::operator*((tcu *)&globalSize,&a->m_localSize,b);
  uVar7 = glu::getDataTypeScalarSize(this->m_varType);
  uVar9 = (a->m_localSize).m_data[1];
  uVar16 = (a->m_localSize).m_data[0];
  uVar17 = (a->m_localSize).m_data[2];
  uVar18 = (a->m_numWorkGroups).m_data[0];
  uVar19 = (a->m_numWorkGroups).m_data[1];
  uVar8 = this->m_varType - TYPE_UINT;
  local_5b0 = 0;
  if (uVar8 < 4) {
    local_5b0 = *(int *)(&DAT_009d414c + (ulong)uVar8 * 4);
  }
  uVar8 = (a->m_numWorkGroups).m_data[2];
  pDVar2 = this->m_vki;
  pVVar3 = this->m_device;
  pAVar11 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_358,8,0x10);
  compute::Buffer::Buffer
            (&uniformBuffer,pDVar2,pVVar3,pAVar11,(VkBufferCreateInfo *)local_358,
             (MemoryRequirement)0x1);
  pDVar2 = this->m_vki;
  pVVar3 = this->m_device;
  pAVar11 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  uVar20 = (ulong)(local_5b0 * uVar9 * uVar16 * uVar17 * uVar18 * uVar19 * uVar8);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_358,uVar20,0x20);
  compute::Buffer::Buffer
            (&resultBuffer,pDVar2,pVVar3,pAVar11,(VkBufferCreateInfo *)local_358,
             (MemoryRequirement)0x1);
  *(ulong *)(uniformBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
            m_hostPtr = CONCAT44(globalSize.m_data[0],globalSize.m_data[1] * globalSize.m_data[0]);
  ::vk::flushMappedMemoryRange
            (this->m_vki,this->m_device,
             (VkDeviceMemory)
             ((uniformBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (uniformBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,8);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_358);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)local_358,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       0x20);
  pDVar12 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar12,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&bufferBarrier,pDVar12,this->m_vki,
             this->m_device,0);
  local_458.m_data.deleter.m_device = (VkDevice)bufferBarrier._16_8_;
  local_458.m_data.deleter.m_allocator = (VkAllocationCallbacks *)bufferBarrier._24_8_;
  local_458.m_data.object.m_internal = bufferBarrier._0_8_;
  local_458.m_data.deleter.m_deviceIface = (DeviceInterface *)bufferBarrier.pNext;
  bufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferBarrier._4_4_ = 0;
  bufferBarrier.pNext = (void *)0x0;
  bufferBarrier.srcAccessMask = 0;
  bufferBarrier.dstAccessMask = 0;
  bufferBarrier.srcQueueFamilyIndex = 0;
  bufferBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&bufferBarrier);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_358);
  pDVar2 = this->m_vki;
  pVVar3 = this->m_device;
  this_00 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::stringbuf::str();
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,(string *)&bufferBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_358,pDVar2,pVVar3,binary,0);
  local_3a8.m_data.deleter.m_device = (VkDevice)local_348[0]._0_8_;
  local_3a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_348[0]._8_8_;
  local_3a8.m_data.object.m_internal = (deUint64)local_358;
  local_3a8.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_350;
  local_358 = (undefined1  [8])0x0;
  pWStack_350 = (pointer)0x0;
  local_348[0]._M_allocated_capacity = (pointer)0x0;
  local_348[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_358);
  std::__cxx11::string::~string((string *)&bufferBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_358,this->m_vki,this->m_device,
                     (VkDescriptorSetLayout)local_458.m_data.object.m_internal);
  local_478.m_data.deleter.m_device = (VkDevice)local_348[0]._0_8_;
  local_478.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_348[0]._8_8_;
  local_478.m_data.object.m_internal = (deUint64)local_358;
  local_478.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_350;
  local_358 = (undefined1  [8])0x0;
  pWStack_350 = (pointer)0x0;
  local_348[0]._M_allocated_capacity = (pointer)0x0;
  local_348[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_358);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)local_358,this->m_vki,this->m_device,
                      (VkPipelineLayout)local_478.m_data.object.m_internal,
                      (VkShaderModule)local_3a8.m_data.object.m_internal);
  local_3c8.m_data.deleter.m_device = (VkDevice)local_348[0]._0_8_;
  local_3c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_348[0]._8_8_;
  local_3c8.m_data.object.m_internal = (deUint64)local_358;
  local_3c8.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_350;
  local_358 = (undefined1  [8])0x0;
  pWStack_350 = (pointer)0x0;
  local_348[0]._M_allocated_capacity = (pointer)0x0;
  local_348[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_358);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&bufferBarrier);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&bufferBarrier,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  pDVar13 = ::vk::DescriptorPoolBuilder::addType(pDVar13,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)local_358,pDVar13,this->m_vki,this->m_device,1
             ,1);
  local_3e8.m_data.deleter.m_device = (VkDevice)local_348[0]._0_8_;
  local_3e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_348[0]._8_8_;
  local_3e8.m_data.object.m_internal = (deUint64)local_358;
  local_3e8.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_350;
  local_358 = (undefined1  [8])0x0;
  pWStack_350 = (pointer)0x0;
  local_348[0]._M_allocated_capacity = (pointer)0x0;
  local_348[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_358);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&bufferBarrier);
  makeBufferMemoryBarrier
            (&bufferBarrier,0x40,0x2000,
             (VkBuffer)
             resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,uVar20);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)local_358,this->m_vki,this->m_device,
                  this->m_queueFamilyIndex);
  local_408.m_data.deleter.m_device = (VkDevice)local_348[0]._0_8_;
  local_408.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_348[0]._8_8_;
  local_408.m_data.object.m_internal = (deUint64)local_358;
  local_408.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_350;
  local_358 = (undefined1  [8])0x0;
  pWStack_350 = (pointer)0x0;
  local_348[0]._M_allocated_capacity = (pointer)0x0;
  local_348[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_358);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_358,this->m_vki,this->m_device,
             (VkCommandPool)local_408.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_548.m_data.deleter.m_device = (VkDevice)local_348[0]._0_8_;
  local_548.m_data.deleter.m_pool.m_internal = local_348[0]._8_8_;
  local_548.m_data.object = (VkCommandBuffer_s *)local_358;
  local_548.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_350;
  local_358 = (undefined1  [8])0x0;
  pWStack_350 = (pointer)0x0;
  local_348[0]._M_allocated_capacity = (pointer)0x0;
  local_348[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_358);
  beginCommandBuffer(this->m_vki,local_548.m_data.object);
  (*this->m_vki->_vptr_DeviceInterface[0x4c])
            (this->m_vki,local_548.m_data.object,1,local_3c8.m_data.object.m_internal);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)local_358,this->m_vki,this->m_device,
                    (VkDescriptorPool)local_3e8.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_458.m_data.object.m_internal);
  local_4d8.m_data.deleter.m_device = (VkDevice)local_348[0]._0_8_;
  local_4d8.m_data.deleter.m_pool.m_internal = local_348[0]._8_8_;
  local_4d8.m_data.object.m_internal = (deUint64)local_358;
  local_4d8.m_data.deleter.m_deviceIface = (DeviceInterface *)pWStack_350;
  local_358 = (undefined1  [8])0x0;
  pWStack_350 = (pointer)0x0;
  local_348[0]._M_allocated_capacity = (pointer)0x0;
  local_348[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_358);
  resultDescriptorInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultDescriptorInfo.offset = 0;
  uniformDescriptorInfo.buffer.m_internal =
       uniformBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  uniformDescriptorInfo.offset = 0;
  uniformDescriptorInfo.range = 8;
  resultDescriptorInfo.range = uVar20;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_358);
  local_558.v = (UVec3 *)0x0;
  pDVar14 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)local_358,
                       (VkDescriptorSet)local_4d8.m_data.object.m_internal,(Location *)&local_558,
                       VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,&uniformDescriptorInfo);
  local_4f8.v = (UVec3 *)0x1;
  pDVar14 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar14,(VkDescriptorSet)local_4d8.m_data.object.m_internal,
                       (Location *)&local_4f8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       &resultDescriptorInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar14,this->m_vki,this->m_device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_358);
  (*this->m_vki->_vptr_DeviceInterface[0x56])
            (this->m_vki,local_548.m_data.object,1,local_478.m_data.object.m_internal,0,1,&local_4d8
             ,0,0);
  (*this->m_vki->_vptr_DeviceInterface[0x5d])
            (this->m_vki,local_548.m_data.object,(ulong)(a->m_numWorkGroups).m_data[0],
             (ulong)(a->m_numWorkGroups).m_data[1],(ulong)(a->m_numWorkGroups).m_data[2]);
  (*this->m_vki->_vptr_DeviceInterface[0x6d])
            (this->m_vki,local_548.m_data.object,0x800,0x4000,0,0,0,1,&bufferBarrier,0,0);
  endCommandBuffer(this->m_vki,local_548.m_data.object);
  submitCommandsAndWait(this->m_vki,this->m_device,this->m_queue,local_548.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (this->m_vki,this->m_device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,uVar20);
  pvVar4 = (resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx;
  iVar10 = 0;
  uVar20 = 0;
  if (0 < (int)uVar7) {
    uVar20 = (ulong)uVar7;
  }
  for (uVar9 = 0; uVar9 < (a->m_numWorkGroups).m_data[2]; uVar9 = uVar9 + 1) {
    for (uVar16 = 0; uVar16 < (a->m_numWorkGroups).m_data[1]; uVar16 = uVar16 + 1) {
      for (uVar17 = 0; uVar17 < b->m_data[0]; uVar17 = uVar17 + 1) {
        for (uVar18 = 0; uVar18 < (a->m_localSize).m_data[2]; uVar18 = uVar18 + 1) {
          for (uVar19 = 0; uVar19 < (a->m_localSize).m_data[1]; uVar19 = uVar19 + 1) {
            for (uVar8 = 0; uVar8 < (a->m_localSize).m_data[0]; uVar8 = uVar8 + 1) {
              refLocalID.m_data[0] = uVar8;
              refLocalID.m_data[1] = uVar19;
              refLocalID.m_data[2] = uVar18;
              refGroupID.m_data[0] = uVar17;
              refGroupID.m_data[1] = uVar16;
              refGroupID.m_data[2] = uVar9;
              tcu::operator*((tcu *)local_358,&refGroupID,&a->m_localSize);
              tcu::operator+((tcu *)&refGlobalID,(Vector<unsigned_int,_3> *)local_358,&refLocalID);
              iVar21 = refGlobalID.m_data[1] * globalSize.m_data[0] +
                       refGlobalID.m_data[2] * globalSize.m_data[1] * globalSize.m_data[0] +
                       refGlobalID.m_data[0];
              (*(this->m_builtin_var_case->super_TestCase).super_TestCase.super_TestNode.
                _vptr_TestNode[7])(&refValue,this->m_builtin_var_case,b,a,&refGroupID,&refLocalID);
              tcu::Vector<unsigned_int,_3>::Vector(&resValue);
              for (uVar15 = 0; uVar20 != uVar15; uVar15 = uVar15 + 1) {
                resValue.m_data[uVar15] =
                     *(uint *)((long)pvVar4 + uVar15 * 4 + (ulong)(uint)(iVar21 * local_5b0));
              }
              if (uVar7 == 3) {
                bVar6 = tcu::allEqual<unsigned_int,3>(&refValue,&resValue);
                if (!bVar6) {
LAB_006cdf59:
                  if (iVar10 < 10) {
                    local_358 = (undefined1  [8])pTVar5->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_350);
                    std::operator<<((ostream *)&pWStack_350,"ERROR: comparison failed at offset ");
                    std::ostream::_M_insert<unsigned_long>((ulong)&pWStack_350);
                    std::operator<<((ostream *)&pWStack_350,": expected ");
                    local_558.v = &refValue;
                    local_558.numComps = uVar7;
                    tcu::MessageBuilder::operator<<((MessageBuilder *)local_358,&local_558);
                    std::operator<<((ostream *)&pWStack_350,", got ");
                    local_4f8.v = &resValue;
                    local_4f8.numComps = uVar7;
                    tcu::MessageBuilder::operator<<((MessageBuilder *)local_358,&local_4f8);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_358,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_350);
                  }
                  else if (iVar10 == 10) {
                    local_358 = (undefined1  [8])pTVar5->m_log;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_350);
                    std::operator<<((ostream *)&pWStack_350,"...");
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_358,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_350);
                  }
                  iVar10 = iVar10 + 1;
                }
              }
              else if (refValue.m_data[0] != resValue.m_data[0]) goto LAB_006cdf59;
            }
          }
        }
      }
    }
  }
  local_358 = (undefined1  [8])pTVar5->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_350);
  std::ostream::_M_insert<unsigned_long>((ulong)&pWStack_350);
  std::operator<<((ostream *)&pWStack_350," / ");
  std::ostream::_M_insert<unsigned_long>((ulong)&pWStack_350);
  std::operator<<((ostream *)&pWStack_350," values passed");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_358,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_350);
  if (iVar10 < 1) {
    iVar10 = this->m_subCaseNdx + 1;
    this->m_subCaseNdx = iVar10;
    if (iVar10 < (int)(((long)(this->m_subCases).
                              super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_subCases).
                             super__Vector_base<vkt::compute::(anonymous_namespace)::SubCase,_std::allocator<vkt::compute::(anonymous_namespace)::SubCase>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
      tcu::TestStatus::incomplete();
      goto LAB_006ce250;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_358,"Comparison succeeded",(allocator<char> *)&local_558);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_358);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_358,"Comparison failed",(allocator<char> *)&local_558);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_358);
  }
  std::__cxx11::string::~string((string *)local_358);
LAB_006ce250:
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_4d8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_548);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_408);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_3e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_3c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_478);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_3a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_458);
  compute::Buffer::~Buffer(&resultBuffer);
  compute::Buffer::~Buffer(&uniformBuffer);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program_name);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	ComputeBuiltinVarInstance::iterate (void)
{
	std::ostringstream program_name;
	program_name << s_prefixProgramName << m_subCaseNdx;

	const SubCase&				subCase				= m_subCases[m_subCaseNdx];
	const tcu::UVec3			globalSize			= subCase.localSize()*subCase.numWorkGroups();
	const tcu::UVec2			stride				(globalSize[0] * globalSize[1], globalSize[0]);
	const deUint32				sizeOfUniformBuffer	= sizeof(stride);
	const int					numScalars			= glu::getDataTypeScalarSize(m_varType);
	const deUint32				numInvocations		= subCase.localSize()[0] * subCase.localSize()[1] * subCase.localSize()[2] * subCase.numWorkGroups()[0] * subCase.numWorkGroups()[1] * subCase.numWorkGroups()[2];

	deUint32					resultBufferStride = 0;
	switch (m_varType)
	{
		case glu::TYPE_UINT:
			resultBufferStride = sizeof(deUint32);
			break;
		case glu::TYPE_UINT_VEC2:
			resultBufferStride = sizeof(tcu::UVec2);
			break;
		case glu::TYPE_UINT_VEC3:
		case glu::TYPE_UINT_VEC4:
			resultBufferStride = sizeof(tcu::UVec4);
			break;
		default:
			DE_ASSERT("Illegal data type");
	}

	const deUint32				resultBufferSize	= numInvocations * resultBufferStride;

	// Create result buffer
	Buffer uniformBuffer(m_vki, m_device, m_context.getDefaultAllocator(), makeBufferCreateInfo(sizeOfUniformBuffer, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT), MemoryRequirement::HostVisible);
	Buffer resultBuffer(m_vki, m_device, m_context.getDefaultAllocator(), makeBufferCreateInfo(resultBufferSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = uniformBuffer.getAllocation();
		memcpy(alloc.getHostPtr(), &stride, sizeOfUniformBuffer);
		flushMappedMemoryRange(m_vki, m_device, alloc.getMemory(), alloc.getOffset(), sizeOfUniformBuffer);
	}

	// Create descriptorSetLayout
	const Unique<VkDescriptorSetLayout>	descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(m_vki, m_device));

	const Unique<VkShaderModule> shaderModule(createShaderModule(m_vki, m_device, m_context.getBinaryCollection().get(program_name.str()), 0u));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(m_vki, m_device, *descriptorSetLayout));
	const Unique<VkPipeline> pipeline(makeComputePipeline(m_vki, m_device, *pipelineLayout, *shaderModule));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(m_vki, m_device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const VkBufferMemoryBarrier bufferBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSize);

	const Unique<VkCommandPool> cmdPool(makeCommandPool(m_vki, m_device, m_queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(m_vki, m_device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(m_vki, *cmdBuffer);

	m_vki.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

	// Create descriptor set
	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(m_vki, m_device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo resultDescriptorInfo = makeDescriptorBufferInfo(*resultBuffer, 0ull, resultBufferSize);
	const VkDescriptorBufferInfo uniformDescriptorInfo = makeDescriptorBufferInfo(*uniformBuffer, 0ull, sizeOfUniformBuffer);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &uniformDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultDescriptorInfo)
		.update(m_vki, m_device);

	m_vki.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	// Dispatch indirect compute command
	m_vki.cmdDispatch(*cmdBuffer, subCase.numWorkGroups()[0], subCase.numWorkGroups()[1], subCase.numWorkGroups()[2]);

	m_vki.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0,
							 0, (const VkMemoryBarrier*)DE_NULL,
							 1, &bufferBarrier,
							 0, (const VkImageMemoryBarrier*)DE_NULL);

	// End recording commands
	endCommandBuffer(m_vki, *cmdBuffer);

	// Wait for command buffer execution finish
	submitCommandsAndWait(m_vki, m_device, m_queue, *cmdBuffer);

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(m_vki, m_device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSize);

	const deUint8*	 ptr = reinterpret_cast<deUint8*>(resultAlloc.getHostPtr());

	int			numFailed		= 0;
	const int	maxLogPrints	= 10;

	tcu::TestContext& testCtx	= m_context.getTestContext();

	for (deUint32 groupZ = 0; groupZ < subCase.numWorkGroups().z(); groupZ++)
	for (deUint32 groupY = 0; groupY < subCase.numWorkGroups().y(); groupY++)
	for (deUint32 groupX = 0; groupX < subCase.numWorkGroups().x(); groupX++)
	for (deUint32 localZ = 0; localZ < subCase.localSize().z(); localZ++)
	for (deUint32 localY = 0; localY < subCase.localSize().y(); localY++)
	for (deUint32 localX = 0; localX < subCase.localSize().x(); localX++)
	{
		const UVec3			refGroupID(groupX, groupY, groupZ);
		const UVec3			refLocalID(localX, localY, localZ);
		const UVec3			refGlobalID = refGroupID * subCase.localSize() + refLocalID;

		const deUint32		refOffset = stride.x()*refGlobalID.z() + stride.y()*refGlobalID.y() + refGlobalID.x();

		const UVec3			refValue = m_builtin_var_case->computeReference(subCase.numWorkGroups(), subCase.localSize(), refGroupID, refLocalID);

		const deUint32*		resPtr = (const deUint32*)(ptr + refOffset * resultBufferStride);
		const UVec3			resValue = readResultVec(resPtr, numScalars);

		if (!compareNumComponents(refValue, resValue, numScalars))
		{
			if (numFailed < maxLogPrints)
				testCtx.getLog()
				<< TestLog::Message
				<< "ERROR: comparison failed at offset " << refOffset
				<< ": expected " << LogComps(refValue, numScalars)
				<< ", got " << LogComps(resValue, numScalars)
				<< TestLog::EndMessage;
			else if (numFailed == maxLogPrints)
				testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

			numFailed += 1;
		}
	}

	testCtx.getLog() << TestLog::Message << (numInvocations - numFailed) << " / " << numInvocations << " values passed" << TestLog::EndMessage;

	if (numFailed > 0)
		return tcu::TestStatus::fail("Comparison failed");

	m_subCaseNdx += 1;
	return (m_subCaseNdx < (int)m_subCases.size()) ? tcu::TestStatus::incomplete() :tcu::TestStatus::pass("Comparison succeeded");
}